

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCaseHandle *testCase)

{
  IEventListenerPtr *this_00;
  Totals *this_01;
  uint64_t *puVar1;
  TestCaseInfo *_testInfo;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  IEventListener *pIVar5;
  SectionTracker *pSVar6;
  undefined4 extraout_var;
  long lVar7;
  string oneRunCerr;
  string oneRunCout;
  string redirectedCerr;
  string redirectedCout;
  Totals beforeRunTotals;
  Totals prevTotals;
  TestCaseStats statsForOneRun;
  Totals singleRunTotals;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  Totals local_188;
  Totals local_148;
  TestCaseStats local_100;
  Totals local_70;
  
  local_148.assertions.passed = (this->m_totals).assertions.passed;
  local_148.assertions.failed = (this->m_totals).assertions.failed;
  local_148.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_148.assertions.skipped = (this->m_totals).assertions.skipped;
  local_148.testCases.passed = (this->m_totals).testCases.passed;
  local_148.testCases.failed = (this->m_totals).testCases.failed;
  local_148.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_148.testCases.skipped = (this->m_totals).testCases.skipped;
  _testInfo = testCase->m_info;
  this_00 = &this->m_reporter;
  pIVar5 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
  (*pIVar5->_vptr_IEventListener[5])(pIVar5,_testInfo);
  this->m_activeTestCase = testCase;
  pSVar6 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  iVar4 = (*(pSVar6->super_TrackerBase).super_ITracker._vptr_ITracker[5])(pSVar6);
  if ((char)iVar4 == '\0') {
    __assert_fail("rootTracker.isSectionTracker()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1485,"Totals Catch::RunContext::runTest(const TestCaseHandle &)");
  }
  this_01 = &this->m_totals;
  iVar4 = (*this->m_config->_vptr_IConfig[0x15])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar4));
  seedRng(this->m_config);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_1c8.field_2._M_local_buf[0] = '\0';
  lVar7 = 0;
  do {
    (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_ptr;
    (this->m_trackerContext).m_runState = Executing;
    local_100.testInfo = (TestCaseInfo *)(_testInfo->name)._M_dataplus._M_p;
    local_100.totals.assertions.passed = (_testInfo->name)._M_string_length;
    local_100.totals.assertions.failed = (uint64_t)(_testInfo->lineInfo).file;
    local_100.totals.assertions.failedButOk = (_testInfo->lineInfo).line;
    pSVar6 = TestCaseTracking::SectionTracker::acquire
                       (&this->m_trackerContext,(NameAndLocationRef *)&local_100);
    this->m_testCaseTracker = (ITracker *)pSVar6;
    pIVar5 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
    (*pIVar5->_vptr_IEventListener[6])(pIVar5,_testInfo,lVar7);
    local_188.assertions.passed = (this_01->assertions).passed;
    local_188.assertions.failed = (this->m_totals).assertions.failed;
    local_188.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
    local_188.assertions.skipped = (this->m_totals).assertions.skipped;
    local_188.testCases.passed = (this->m_totals).testCases.passed;
    local_188.testCases.failed = (this->m_totals).testCases.failed;
    local_188.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
    local_188.testCases.skipped = (this->m_totals).testCases.skipped;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    runCurrentTest(this,&local_1e8,&local_208);
    std::__cxx11::string::append((string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_1c8);
    Totals::delta(&local_70,this_01,&local_188);
    bVar3 = aborting(this);
    TestCaseStats::TestCaseStats(&local_100,_testInfo,&local_70,&local_1e8,&local_208,bVar3);
    pIVar5 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
    (*pIVar5->_vptr_IEventListener[0xf])(pIVar5,&local_100,lVar7);
    TestCaseStats::~TestCaseStats(&local_100);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (this->m_testCaseTracker->m_runState == CompletedSuccessfully) break;
    bVar3 = aborting(this);
    lVar7 = lVar7 + 1;
  } while (!bVar3);
  Totals::delta(__return_storage_ptr__,this_01,&local_148);
  uVar2 = (__return_storage_ptr__->testCases).passed;
  if ((uVar2 != 0 & _testInfo->properties >> 2) == 1) {
    puVar1 = &(__return_storage_ptr__->assertions).failed;
    *puVar1 = *puVar1 + 1;
    (__return_storage_ptr__->testCases).passed = uVar2 - 1;
    puVar1 = &(__return_storage_ptr__->testCases).failed;
    *puVar1 = *puVar1 + 1;
  }
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar5 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
  bVar3 = aborting(this);
  TestCaseStats::TestCaseStats
            (&local_100,_testInfo,__return_storage_ptr__,&local_1a8,&local_1c8,bVar3);
  (*pIVar5->_vptr_IEventListener[0x10])(pIVar5,&local_100);
  TestCaseStats::~TestCaseStats(&local_100);
  this->m_activeTestCase = (TestCaseHandle *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

Totals RunContext::runTest(TestCaseHandle const& testCase) {
        const Totals prevTotals = m_totals;

        auto const& testInfo = testCase.getTestCaseInfo();
        m_reporter->testCaseStarting(testInfo);
        m_activeTestCase = &testCase;


        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());

        // We intentionally only seed the internal RNG once per test case,
        // before it is first invoked. The reason for that is a complex
        // interplay of generator/section implementation details and the
        // Random*Generator types.
        //
        // The issue boils down to us needing to seed the Random*Generators
        // with different seed each, so that they return different sequences
        // of random numbers. We do this by giving them a number from the
        // shared RNG instance as their seed.
        //
        // However, this runs into an issue if the reseeding happens each
        // time the test case is entered (as opposed to first time only),
        // because multiple generators could get the same seed, e.g. in
        // ```cpp
        // TEST_CASE() {
        //     auto i = GENERATE(take(10, random(0, 100));
        //     SECTION("A") {
        //         auto j = GENERATE(take(10, random(0, 100));
        //     }
        //     SECTION("B") {
        //         auto k = GENERATE(take(10, random(0, 100));
        //     }
        // }
        // ```
        // `i` and `j` would properly return values from different sequences,
        // but `i` and `k` would return the same sequence, because their seed
        // would be the same.
        // (The reason their seeds would be the same is that the generator
        //  for k would be initialized when the test case is entered the second
        //  time, after the shared RNG instance was reset to the same value
        //  it had when the generator for i was initialized.)
        seedRng( *m_config );

        uint64_t testRuns = 0;
        std::string redirectedCout;
        std::string redirectedCerr;
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocationRef(testInfo.name, testInfo.lineInfo));

            m_reporter->testCasePartialStarting(testInfo, testRuns);

            const auto beforeRunTotals = m_totals;
            std::string oneRunCout, oneRunCerr;
            runCurrentTest(oneRunCout, oneRunCerr);
            redirectedCout += oneRunCout;
            redirectedCerr += oneRunCerr;

            const auto singleRunTotals = m_totals.delta(beforeRunTotals);
            auto statsForOneRun = TestCaseStats(testInfo, singleRunTotals, CATCH_MOVE(oneRunCout), CATCH_MOVE(oneRunCerr), aborting());

            m_reporter->testCasePartialEnded(statsForOneRun, testRuns);
            ++testRuns;
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  CATCH_MOVE(redirectedCout),
                                  CATCH_MOVE(redirectedCerr),
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }